

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ast.cpp
# Opt level: O0

void __thiscall Ast::print_recursive(Ast *this,Node *current_node,size_t level)

{
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [36];
  int local_24;
  size_t sStack_20;
  int i;
  size_t level_local;
  Node *current_node_local;
  Ast *this_local;
  
  if (current_node != (Node *)0x0) {
    sStack_20 = level;
    level_local = (size_t)current_node;
    current_node_local = (Node *)this;
    for (local_24 = 0; (ulong)(long)local_24 < sStack_20; local_24 = local_24 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"  ",&local_49);
      cout_log((string *)local_48);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"+-",&local_81);
    cout_log((string *)local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    switch(*(undefined4 *)(level_local + 0x20)) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"PROG",&local_a9);
      cout_log((string *)local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      break;
    case 1:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"EXPR",&local_d1);
      cout_log((string *)local_d0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      break;
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"DCLRT",&local_f9);
      cout_log((string *)local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"SEQ",&local_121);
      cout_log((string *)local_120);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      break;
    case 4:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"SET",&local_149);
      cout_log((string *)local_148);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      break;
    case 5:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"IF",&local_171);
      cout_log((string *)local_170);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      break;
    case 6:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"ELSE",&local_199);
      cout_log((string *)local_198);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      break;
    case 7:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"FOR",&local_1c1);
      cout_log((string *)local_1c0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      break;
    case 8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"VARIABLE ",&local_1e9);
      cout_log((string *)local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"(",&local_211);
      cout_log((string *)local_210);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::__cxx11::string::string(local_238,(string *)level_local);
      cout_log((string *)local_238);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,")",&local_259);
      cout_log((string *)local_258);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      break;
    case 9:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"NUMBER ",&local_281);
      cout_log((string *)local_280);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"(",&local_2a9);
      cout_log((string *)local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::string(local_2d0,(string *)level_local);
      cout_log((string *)local_2d0);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,")",&local_2f1);
      cout_log((string *)local_2f0);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      break;
    case 10:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,"MORE",&local_319);
      cout_log((string *)local_318);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      break;
    case 0xb:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"LESS",&local_341);
      cout_log((string *)local_340);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      break;
    case 0xc:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"EQUALITY",&local_369);
      cout_log((string *)local_368);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      break;
    case 0xd:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"ADD",&local_391);
      cout_log((string *)local_390);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      break;
    case 0xe:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b8,"SUB",&local_3b9);
      cout_log((string *)local_3b8);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
      break;
    case 0xf:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e0,"MUL",&local_3e1);
      cout_log((string *)local_3e0);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      break;
    case 0x10:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,"DIV",&local_409);
      cout_log((string *)local_408);
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      break;
    case 0x11:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_430,"PRINTLN",&local_431);
      cout_log((string *)local_430);
      std::__cxx11::string::~string(local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
    }
    endl_log();
    print_recursive(this,*(Node **)(level_local + 0x28),sStack_20 + 1);
    print_recursive(this,*(Node **)(level_local + 0x30),sStack_20 + 1);
    print_recursive(this,*(Node **)(level_local + 0x38),sStack_20 + 1);
    print_recursive(this,*(Node **)(level_local + 0x40),sStack_20 + 1);
  }
  return;
}

Assistant:

void Ast::print_recursive(Node* current_node, size_t level)
{
	if (current_node == nullptr) {
		return;
	}

	for (int i = 0; i < level; ++i) {
		cout_log("  ");
	}

	cout_log("+-");

	switch (current_node->type){
		case node_type::PROG:{
			cout_log("PROG");
			break;
		}
		case node_type::EXPR:{
			cout_log("EXPR");
			break;
		}
		case node_type::DCLRT: {
			cout_log("DCLRT");
			break;
		}
		case node_type::SEQ: {
			cout_log("SEQ");
			break;
		}
		case node_type::SET: {
			cout_log("SET");
			break;
		}
		case node_type::IF: {
			cout_log("IF");
			break;
		}
		case node_type::ELSE: {
			cout_log("ELSE");
			break;
		}
		case node_type::FOR: {
			cout_log("FOR");
			break;
		}
		case node_type::VARIABLE: {
			cout_log("VARIABLE ");
			cout_log("(");
			cout_log(current_node->value);
			cout_log(")");
			break;
		}
		case node_type::NUMBER:{
			cout_log("NUMBER ");
			cout_log("(");
			cout_log(current_node->value);
			cout_log(")");
			break;
		}
		case node_type::MORE: {
			cout_log("MORE");
			break;
		}
		case node_type::LESS: {
			cout_log("LESS");
			break;
		}
		case node_type::EQUALITY: {
			cout_log("EQUALITY");
			break;
		}
		case node_type::ADD:{
			cout_log("ADD");
			break;
		}
		case node_type::SUB:{
			cout_log("SUB");
			break;
		}
		case node_type::MUL:{
			cout_log("MUL");
			break;
		}
		case node_type::DIV:{
			cout_log("DIV");
			break;
		}
		case node_type::PRINTLN: {
			cout_log("PRINTLN");
			break;
		}
	}

	endl_log();

	print_recursive(current_node->operand1, level + 1);
	print_recursive(current_node->operand2, level + 1);
	print_recursive(current_node->operand3, level + 1);
	print_recursive(current_node->operand4, level + 1);

}